

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ugui.c
# Opt level: O2

void ugui_window_stack_push(ugui_t *gui,ugui_window_t *window)

{
  uint uVar1;
  
  if (gui->window_index == 0) {
    uVar1 = 0;
  }
  else {
    _ugui_window_unload(gui->windows[gui->window_index - 1]);
    uVar1 = gui->window_index;
  }
  gui->windows[uVar1] = window;
  gui->window_index = uVar1 + 1;
  _ugui_window_load(window);
  return;
}

Assistant:

void ugui_window_stack_push(ugui_t* gui, ugui_window_t *window)
{
	//Unload last window
	if (gui->window_index > 0) {
		ugui_window_t *last = gui->windows[gui->window_index - 1];
		_ugui_window_unload(last);
	}

	//Update pointer
	gui->windows[gui->window_index] = window;
	gui->window_index ++;

	//Load new window
	_ugui_window_load(window);
}